

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnicodeString::doHashCode(UnicodeString *this)

{
  int32_t length;
  char16_t *str;
  undefined4 local_14;
  int32_t hashCode;
  UnicodeString *this_local;
  
  str = getArrayStart(this);
  length = UnicodeString::length(this);
  local_14 = ustr_hashUCharsN_63(str,length);
  if (local_14 == 0) {
    local_14 = 1;
  }
  return local_14;
}

Assistant:

int32_t
UnicodeString::doHashCode() const
{
    /* Delegate hash computation to uhash.  This makes UnicodeString
     * hashing consistent with UChar* hashing.  */
    int32_t hashCode = ustr_hashUCharsN(getArrayStart(), length());
    if (hashCode == kInvalidHashCode) {
        hashCode = kEmptyHashCode;
    }
    return hashCode;
}